

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OjaNewton.cc
# Opt level: O3

void finish(OjaNewton *ON)

{
  long lVar1;
  
  free(ON->ev);
  free(ON->b);
  free(ON->D);
  free(ON->buffer);
  free(ON->weight_buffer);
  free(ON->zv);
  free(ON->vv);
  free(ON->tmp);
  if (0 < ON->m) {
    lVar1 = 0;
    do {
      free(ON->A[lVar1 + 1]);
      free(ON->K[lVar1 + 1]);
      lVar1 = lVar1 + 1;
    } while (lVar1 < ON->m);
  }
  free(ON->A);
  free(ON->K);
  free((ON->data).Zx);
  free((ON->data).AZx);
  free((ON->data).delta);
  return;
}

Assistant:

void finish(OjaNewton& ON)
{
  free(ON.ev);
  free(ON.b);
  free(ON.D);
  free(ON.buffer);
  free(ON.weight_buffer);
  free(ON.zv);
  free(ON.vv);
  free(ON.tmp);

  for (int i = 1; i <= ON.m; i++)
  {
    free(ON.A[i]);
    free(ON.K[i]);
  }
  free(ON.A);
  free(ON.K);

  free(ON.data.Zx);
  free(ON.data.AZx);
  free(ON.data.delta);
}